

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

void __thiscall QColumnViewPrivate::changeCurrentColumn(QColumnViewPrivate *this)

{
  QWidget *this_00;
  QWidget *this_01;
  QWidget *this_02;
  bool bVar1;
  QItemSelectionModel *pQVar2;
  QItemSelectionModel *pQVar3;
  QAbstractItemModel *pQVar4;
  int iVar5;
  ulong uVar6;
  QAbstractItemView *pQVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  undefined8 local_90;
  undefined1 *local_88;
  QAbstractItemModel *pQStack_80;
  undefined8 local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->columns).d.size == 0) goto LAB_0055fb96;
  this_00 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this_00);
  if ((((int)local_58 < 0) || ((long)local_58 < 0)) || (local_48.ptr == (QAbstractItemModel *)0x0))
  goto LAB_0055fb96;
  closeColumns(this,(QModelIndex *)&local_58,true);
  uVar8 = (this->columns).d.size;
  uVar6 = 2;
  if (2 < uVar8) {
    uVar6 = uVar8;
  }
  iVar5 = (int)uVar6 + -2;
  this_01 = (QWidget *)(this->columns).d.ptr[iVar5];
  bVar1 = QWidget::hasFocus(this_00);
  if (bVar1) {
    QWidget::setFocus(this_01,OtherFocusReason);
  }
  QWidget::setFocusProxy(this_00,this_01);
  if ((this->columns).d.size != 0) {
    uVar8 = 0;
    do {
      pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)(this->columns).d.ptr[uVar8]);
      pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this_00);
      if (pQVar2 == pQVar3) {
        pQVar2 = (QItemSelectionModel *)operator_new(0x10);
        pQVar4 = QAbstractItemView::model((QAbstractItemView *)this_01);
        QItemSelectionModel::QItemSelectionModel(pQVar2,pQVar4);
        QAbstractItemView::selectionModel((QAbstractItemView *)this_00);
        QItemSelectionModel::currentIndex();
        (**(code **)(*(long *)pQVar2 + 0x60))(pQVar2,&local_78,0x10);
        QAbstractItemView::selectionModel((QAbstractItemView *)this_00);
        QItemSelectionModel::selection();
        (**(code **)(*(long *)pQVar2 + 0x70))(pQVar2,&local_78,2);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
                  ((QArrayDataPointer<QItemSelectionRange> *)&local_78);
        this_02 = (QWidget *)(this->columns).d.ptr[uVar8];
        (**(code **)(*(long *)this_02 + 0x1d0))(this_02);
        QWidget::setFocusPolicy(this_02,NoFocus);
        uVar8 = (ulong)((int)uVar8 + 1);
        if (uVar8 < (ulong)(this->columns).d.size) {
          tStack_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_78 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
          QAbstractItemView::rootIndex
                    ((QModelIndex *)&local_78,(QAbstractItemView *)(this->columns).d.ptr[uVar8]);
          if (((-1 < (int)local_78) && (-1 < (long)local_78)) &&
             (tStack_68.ptr != (QAbstractItemModel *)0x0)) {
            QAbstractItemView::setCurrentIndex
                      ((QAbstractItemView *)this_02,(QModelIndex *)&local_78);
          }
        }
        break;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)(this->columns).d.size);
  }
  QAbstractItemView::selectionModel((QAbstractItemView *)this_01);
  QObject::deleteLater();
  QWidget::setFocusPolicy(this_01,StrongFocus);
  pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)this_00);
  (**(code **)(*(long *)this_01 + 0x1d0))(this_01,pQVar2);
  if (0 < iVar5) {
    pQVar7 = (QAbstractItemView *)(this->columns).d.ptr[(int)uVar6 - 3];
    QAbstractItemView::currentIndex((QModelIndex *)&local_78,pQVar7);
    if (local_48.ptr == (QAbstractItemModel *)0x0) {
      local_90 = 0xffffffffffffffff;
      local_88 = (undefined1 *)0x0;
      pQStack_80 = (QAbstractItemModel *)0x0;
      local_90._0_4_ = -1;
    }
    else {
      (**(code **)(*(long *)local_48.ptr + 0x68))(&local_90,local_48.ptr,&local_58);
    }
    if ((int)local_78 == (int)local_90) {
      if (((local_78._4_4_ == local_90._4_4_) && (puStack_70 == local_88)) &&
         (tStack_68.ptr == pQStack_80)) goto LAB_0055fb28;
    }
    if (local_48.ptr == (QAbstractItemModel *)0x0) {
      local_78 = (Data *)0xffffffffffffffff;
      puStack_70 = (undefined1 *)0x0;
      tStack_68.ptr = (QAbstractItemModel *)0x0;
    }
    else {
      (**(code **)(*(long *)local_48.ptr + 0x68))(&local_78,local_48.ptr,&local_58);
    }
    QAbstractItemView::setCurrentIndex(pQVar7,(QModelIndex *)&local_78);
  }
LAB_0055fb28:
  pQVar7 = (QAbstractItemView *)(this->columns).d.ptr[(this->columns).d.size + -1];
  if (((*(QWidgetData **)(pQVar7 + 0x20))->widget_attributes & 0x10000) != 0) {
    (**(code **)(*(long *)pQVar7 + 0x68))(pQVar7,1);
    pQVar7 = (QAbstractItemView *)(this->columns).d.ptr[(this->columns).d.size + -1];
  }
  pQVar2 = QAbstractItemView::selectionModel(pQVar7);
  if (pQVar2 != (QItemSelectionModel *)0x0) {
    pQVar2 = QAbstractItemView::selectionModel
                       ((QAbstractItemView *)(this->columns).d.ptr[(this->columns).d.size + -1]);
    (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2);
  }
  updateScrollbars(this);
LAB_0055fb96:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnViewPrivate::changeCurrentColumn()
{
    Q_Q(QColumnView);
    if (columns.isEmpty())
        return;

    QModelIndex current = q->currentIndex();
    if (!current.isValid())
        return;

    // We might have scrolled far to the left so we need to close all of the children
    closeColumns(current, true);

    // Set up the "current" column with focus
    int currentColumn = qMax(0, columns.size() - 2);
    QAbstractItemView *parentColumn = columns.at(currentColumn);
    if (q->hasFocus())
        parentColumn->setFocus(Qt::OtherFocusReason);
    q->setFocusProxy(parentColumn);

    // find the column that is our current selection model and give it a new one.
    for (int i = 0; i < columns.size(); ++i) {
        if (columns.at(i)->selectionModel() == q->selectionModel()) {
            QItemSelectionModel *replacementSelectionModel =
                new QItemSelectionModel(parentColumn->model());
            replacementSelectionModel->setCurrentIndex(
                q->selectionModel()->currentIndex(), QItemSelectionModel::Current);
            replacementSelectionModel->select(
                q->selectionModel()->selection(), QItemSelectionModel::Select);
            QAbstractItemView *view = columns.at(i);
            view->setSelectionModel(replacementSelectionModel);
            view->setFocusPolicy(Qt::NoFocus);
            if (columns.size() > i + 1) {
                const QModelIndex newRootIndex = columns.at(i + 1)->rootIndex();
                if (newRootIndex.isValid())
                    view->setCurrentIndex(newRootIndex);
            }
            break;
        }
    }
    parentColumn->selectionModel()->deleteLater();
    parentColumn->setFocusPolicy(Qt::StrongFocus);
    parentColumn->setSelectionModel(q->selectionModel());
    // We want the parent selection to stay highlighted (but dimmed depending upon the color theme)
    if (currentColumn > 0) {
        parentColumn = columns.at(currentColumn - 1);
        if (parentColumn->currentIndex() != current.parent())
            parentColumn->setCurrentIndex(current.parent());
    }

    if (columns.constLast()->isHidden()) {
        columns.constLast()->setVisible(true);
    }
    if (columns.constLast()->selectionModel())
        columns.constLast()->selectionModel()->clear();
    updateScrollbars();
}